

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::add_sample
          (TypedTimeSamples<std::array<float,_2UL>_> *this,double t,array<float,_2UL> *v)

{
  pointer *ppSVar1;
  iterator __position;
  Sample s;
  Sample local_20;
  
  local_20.blocked = false;
  local_20.value = *(array<float,_2UL> *)v->_M_elems;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)&(__position._M_current)->blocked = (ulong)(uint7)local_20._17_7_ << 8;
    (__position._M_current)->t = t;
    *&((__position._M_current)->value)._M_elems = local_20.value._M_elems;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }